

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_> *
mathiu::impl::coeffAndTerm
          (pair<std::shared_ptr<const_mathiu::impl::Expr>,_std::shared_ptr<const_mathiu::impl::Expr>_>
           *__return_storage_ptr__,Expr *e)

{
  anon_class_8_1_54a39805 *func;
  undefined1 local_3e1;
  Expr *local_3e0;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:284:27)>
  local_3d8;
  App<_9baf8524_> local_3c8;
  PatternHelper<_fb7f96f9_> local_2c8;
  anon_class_16_2_531e9c02 local_1c8;
  PatternPair<_b5ab6a37_> local_1b8;
  ValueT local_a8 [3];
  undefined1 local_90 [8];
  Id<mathiu::impl::Product> ip;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> icoeff;
  anon_class_1_0_00000001 firstIsCoeff;
  Expr *e_local;
  
  icoeff.mBlock.
  super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  .
  super__Variant_storage_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ._39_1_ = 0;
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&ip.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
             + 0x40));
  matchit::impl::Id<mathiu::impl::Product>::Id((Id<mathiu::impl::Product> *)local_90);
  local_a8[0] = (ValueT)matchit::impl::match<mathiu::impl::Expr_const&>(e);
  local_1c8.ip = (Id<mathiu::impl::Product> *)local_90;
  local_1c8.icoeff =
       (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
       ((long)&ip.mBlock.
               super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
       + 0x40);
  coeffAndTerm(mathiu::impl::Expr_const&)::$_0::operator()
            (&local_3c8,
             (void *)((long)&icoeff.mBlock.
                             super__Variant_base<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                             .
                             super__Move_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                             .
                             super__Copy_assign_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                             .
                             super__Move_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                             .
                             super__Copy_ctor_alias<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
                     + 0x27),local_1c8.icoeff,local_1c8.ip);
  matchit::impl::PatternPipable::operator()
            (&local_2c8,(PatternPipable *)&matchit::impl::pattern,&local_3c8);
  matchit::impl::
  PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::$_0::operator()<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&>(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::{lambda(auto:1&&)#1}const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>>
  ::operator=(&local_1b8,
              (PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Product>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::And<matchit::impl::Ds<matchit::impl::App<mathiu::impl::coeffAndTerm(mathiu::impl::Expr_const&)::__0::operator()<matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&>(matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>&,matchit::impl::Id<mathiu::impl::Product>&)const::_lambda(auto:1&&)_1_const&,matchit::impl::And<matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Or<matchit::impl::App<matchit::impl::AsPointer<int>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>,matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Fraction>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Wildcard>>>>>>,matchit::impl::Id<std::shared_ptr<mathiu::impl::Expr_const>>>>,matchit::impl::Ooo>,matchit::impl::Id<mathiu::impl::Product>>>>>>
               *)&local_2c8,&local_1c8);
  local_3e0 = e;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  local_3d8.mHandler.e =
       (Expr *)matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=
                         ((PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_core_cpp:284:27)>
                           *)&local_3e1,(PatternHelper<matchit::impl::Wildcard> *)&local_3e0,func);
  matchit::impl::MatchHelper<mathiu::impl::Expr_const&,true>::operator()
            (__return_storage_ptr__,(MatchHelper<mathiu::impl::Expr_const&,true> *)local_a8,
             &local_1b8,&local_3d8);
  matchit::impl::PatternPair<$b5ab6a37$>::~PatternPair(&local_1b8);
  matchit::impl::PatternHelper<$fb7f96f9$>::~PatternHelper(&local_2c8);
  matchit::impl::App<$9baf8524$>::~App(&local_3c8);
  matchit::impl::Id<mathiu::impl::Product>::~Id((Id<mathiu::impl::Product> *)local_90);
  matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::~Id
            ((Id<std::shared_ptr<const_mathiu::impl::Expr>_> *)
             ((long)&ip.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Product>,_matchit::impl::IdBlock<mathiu::impl::Product>_*>
             + 0x40));
  return __return_storage_ptr__;
}

Assistant:

std::pair<ExprPtr, ExprPtr> coeffAndTerm(Expr const &e)
    {
        constexpr auto firstIsCoeff = [](auto &&id, auto &&whole)
        {
            constexpr auto asCoeff = or_(as<Integer>(_), as<Fraction>(_));
            constexpr auto second = [](auto &&p)
            {
                return p.second;
            };
            // second part of the first pair
            return as<Product>(whole.at(ds(app(second, id.at(some(asCoeff))), ooo)));
        };

        Id<ExprPtr> icoeff;
        Id<Product> ip;
        return match(e)(
            pattern | firstIsCoeff(icoeff, ip) = [&]
            {
                if ((*ip).size() > 2)
                {
                    auto pCopy = *ip;
                    pCopy.erase(pCopy.begin());
                    return std::make_pair(*icoeff, makeSharedExprPtr(Product{pCopy}));
                }
                // single value left.
                // the basic unary transformation.
                return std::make_pair(*icoeff, (*(*ip).rbegin()).second);
            },
            pattern | _ = [&]
            { return std::make_pair(1_i, makeSharedExprPtr(e)); });
    }